

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O0

void testTiledCompression(string *tempDir)

{
  ostream *poVar1;
  Array2D<unsigned_int> *pi_00;
  Array2D<Imath_3_2::half> *ph_00;
  exception *e;
  int i;
  Array2D<float> pf;
  Array2D<Imath_3_2::half> ph;
  Array2D<unsigned_int> pi;
  int YS;
  int XS;
  int DY [3];
  int DX [3];
  int H;
  int W;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  int height;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff18;
  Array2D<unsigned_int> *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Array2D<float> *in_stack_ffffffffffffff30;
  int local_8c;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Array2D<float> *in_stack_ffffffffffffff80;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff88;
  Array2D<unsigned_int> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  int xs;
  undefined8 uVar3;
  int dx;
  undefined8 uVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing pixel data types and data window offsets for tiled files");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar4 = 0xffffffef;
  uVar3 = 0xffffffe3;
  dx = 0xd;
  xs = 0xf;
  Imf_3_4::Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Imf_3_4::Array2D<float>::Array2D
            ((Array2D<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"xOffset = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)(&stack0xffffffffffffffd8 + (long)local_8c * 4));
    pi_00 = (Array2D<unsigned_int> *)std::operator<<(poVar1,", yOffset = ");
    ph_00 = (Array2D<Imath_3_2::half> *)
            std::ostream::operator<<(pi_00,*(int *)(&stack0xffffffffffffffc8 + (long)local_8c * 4));
    std::ostream::operator<<(ph_00,std::endl<char,std::char_traits<char>>);
    anon_unknown.dwarf_2321f3::fillPixels1
              ((Array2D<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (Array2D<Imath_3_2::half> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (Array2D<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    height = *(int *)(&stack0xffffffffffffffd8 + (long)local_8c * 4);
    uVar2 = *(undefined4 *)(&stack0xffffffffffffffc8 + (long)local_8c * 4);
    anon_unknown.dwarf_2321f3::writeRead
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,xs,
               (int)uVar3,dx,(int)uVar4);
    anon_unknown.dwarf_2321f3::fillPixels2
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (Array2D<float> *)CONCAT44(in_stack_ffffffffffffff14,uVar2),in_stack_ffffffffffffff0c
               ,height);
    anon_unknown.dwarf_2321f3::writeRead
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,xs,
               (int)uVar3,dx,(int)uVar4);
    anon_unknown.dwarf_2321f3::fillPixels3
              (pi_00,ph_00,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff28);
    anon_unknown.dwarf_2321f3::writeRead
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,xs,
               (int)uVar3,dx,(int)uVar4);
    anon_unknown.dwarf_2321f3::fillPixels4
              (pi_00,ph_00,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff08 = *(undefined4 *)(&stack0xffffffffffffffd8 + (long)local_8c * 4);
    in_stack_ffffffffffffff10 = *(undefined4 *)(&stack0xffffffffffffffc8 + (long)local_8c * 4);
    in_stack_ffffffffffffff00 = 0xf;
    in_stack_fffffffffffffef8 = 0xf;
    anon_unknown.dwarf_2321f3::writeRead
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,xs,
               (int)uVar3,dx,(int)uVar4);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_4::Array2D<float>::~Array2D
            ((Array2D<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Imf_3_4::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
  ;
  return;
}

Assistant:

void
testTiledCompression (const std::string& tempDir)
{
    try
    {
        cout << "Testing pixel data types and data "
                "window offsets for tiled files"
             << endl;

        const int W    = 171;
        const int H    = 59;
        const int DX[] = {-17, 0, 23};
        const int DY[] = {-29, 0, 13};
        const int XS   = 15;
        const int YS   = 15;

        Array2D<unsigned int> pi (H, W);
        Array2D<half>         ph (H, W);
        Array2D<float>        pf (H, W);

        //
        // If the following assertion fails, new pixel types have
        // been added to the Imf library; testing code for the new
        // pixel types should be added to this file.
        //

        assert (NUM_PIXELTYPES == 3);

        for (int i = 0; i < 3; ++i)
        {
            cout << endl
                 << "xOffset = " << DX[i]
                 << ", "
                    "yOffset = "
                 << DY[i] << endl;

            fillPixels1 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels2 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels3 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels4 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}